

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::Namespace::Namespace
          (Namespace *this,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  SourceCodeText *pSVar3;
  Scope *pSVar4;
  
  pSVar1 = (processorKeyword->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pcVar2 = (processorKeyword->location).data;
  (this->super_ModuleBase).super_ASTObject.objectType = Namespace;
  pSVar3 = (processorName->location).sourceCode.object;
  (this->super_ModuleBase).super_ASTObject.context.location.sourceCode.object = pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pSVar4 = processorName->parentScope;
  (this->super_ModuleBase).super_ASTObject.context.location.location.data =
       (processorName->location).location.data;
  (this->super_ModuleBase).super_ASTObject.context.parentScope = pSVar4;
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject = (_func_int **)&PTR__ModuleBase_002f5d48
  ;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__ModuleBase_002f5df8;
  (this->super_ModuleBase).processorKeywordLocation.sourceCode.object = pSVar1;
  (this->super_ModuleBase).processorKeywordLocation.location.data = pcVar2;
  (this->super_ModuleBase).name.name = moduleName.name;
  (this->super_ModuleBase).isFullyResolved = false;
  memset(&(this->super_ModuleBase).specialisationParams,0,0xa0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject = (_func_int **)&PTR__Namespace_002f5b48;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__Namespace_002f5c20;
  (this->importsList).imports.items =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->importsList).imports.space;
  (this->importsList).imports.numActive = 0;
  (this->importsList).imports.numAllocated = 4;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subModules).
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constants).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namespaceInstances).
  super__Vector_base<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Namespace (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ObjectType::Namespace, processorKeyword, processorName, moduleName) {}